

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O2

optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> * __thiscall
wasm::WATParser::anon_unknown_10::num
          (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *__return_storage_ptr__,
          anon_unknown_10 *this,string_view in,OverflowBehavior overflow)

{
  bool bVar1;
  bool bVar2;
  string_view sv;
  undefined1 local_60 [8];
  LexIntCtx ctx;
  
  ctx.super_LexCtx.input._M_len = in._M_len;
  ctx.super_LexCtx.input._M_str = (char *)0x0;
  ctx.super_LexCtx.lexedSize._0_5_ = 0;
  ctx.super_LexCtx.lexedSize._5_3_ = 0;
  ctx.n._0_5_ = 0;
  if (this != (anon_unknown_10 *)0x0) {
    local_60 = (undefined1  [8])this;
    bVar1 = LexIntCtx::takeDigit((LexIntCtx *)local_60);
    if (bVar1) {
      ctx._36_4_ = (int)in._M_str;
      do {
        sv._M_str = "_";
        sv._M_len = 1;
        bVar1 = LexCtx::takePrefix((LexCtx *)local_60,sv);
        bVar2 = LexIntCtx::takeDigit((LexIntCtx *)local_60);
      } while (bVar2);
      if (!bVar1) {
        if (ctx._36_4_ != 0) {
          LexIntCtx::lexedRaw(__return_storage_ptr__,(LexIntCtx *)local_60);
          return __return_storage_ptr__;
        }
        LexIntCtx::lexed(__return_storage_ptr__,(LexIntCtx *)local_60);
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>)._M_payload
  .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>._M_engaged =
       false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexIntResult> num(std::string_view in,
                                OverflowBehavior overflow = DisallowOverflow) {
  LexIntCtx ctx(in);
  if (ctx.empty()) {
    return {};
  }
  if (!ctx.takeDigit()) {
    return {};
  }
  while (true) {
    bool under = ctx.takePrefix("_"sv);
    if (!ctx.takeDigit()) {
      if (!under) {
        return overflow == DisallowOverflow ? ctx.lexed() : ctx.lexedRaw();
      }
      // TODO: Add error production for trailing underscore.
      return {};
    }
  }
}